

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void rewindPaths(int previousDecisionLevel,int newDecisionLevel,RewindStyle rewindStyle,long param_4
                )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  Node local_d8;
  
  if (rewindStyle == REWIND_SEND_SKIPPED) {
    std::vector<int,_std::allocator<int>_>::resize
              (&nodepath,
               (long)decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)previousDecisionLevel + -1]);
    std::vector<int,_std::allocator<int>_>::resize
              (&altpath,(long)decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[(long)previousDecisionLevel + -1] -
                        1);
    uVar6 = (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[newDecisionLevel] < (int)(uVar6 >> 2)) {
      paVar1 = &local_d8.label_.value_.field_2;
      paVar2 = &local_d8.nogood_.value_.field_2;
      paVar3 = &local_d8.info_.value_.field_2;
      do {
        iVar7 = nextnodeid + 1;
        if (nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start ==
            nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar6 = 0xffffffff;
        }
        else {
          uVar6 = (ulong)*(uint *)((long)nodepath.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + (uVar6 - 4));
        }
        if (altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start ==
            altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          iVar5 = 0;
        }
        else {
          iVar5 = altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1] + 1;
        }
        if ((so.print_nodes != false) || (profilerConnector->_connected == true)) {
          local_d8.node_.rid = engine.restart_count;
          local_d8.node_.nid = nextnodeid;
          local_d8._c = profilerConnector;
          local_d8.node_.tid = 0;
          local_d8.parent_.tid = 0;
          local_d8.kids_ = 0;
          local_d8.status_ = SKIPPED;
          local_d8.label_.value_._M_string_length = 0;
          local_d8.label_.value_.field_2._M_local_buf[0] = '\0';
          local_d8.label_.present = false;
          local_d8.nogood_.value_._M_string_length = 0;
          local_d8.nogood_.value_.field_2._M_local_buf[0] = '\0';
          local_d8.nogood_.present = false;
          local_d8.info_.value_._M_string_length = 0;
          local_d8.info_.value_.field_2._M_local_buf[0] = '\0';
          local_d8.info_.present = false;
          nextnodeid = iVar7;
          local_d8.parent_._0_8_ = uVar6;
          local_d8.alt_ = iVar5;
          local_d8.label_.value_._M_dataplus._M_p = (pointer)paVar1;
          local_d8.nogood_.value_._M_dataplus._M_p = (pointer)paVar2;
          local_d8.info_.value_._M_dataplus._M_p = (pointer)paVar3;
          if (so.print_nodes != false) {
            cVar4 = std::__basic_file<char>::is_open();
            if (cVar4 == '\0') {
              std::ofstream::open(node_stream,0x1dd83c);
            }
            printNode<cpprofiler::Node&>(&local_d8,(ostream *)node_stream);
            if (so.debug == true) {
              printNode<cpprofiler::Node&>(&local_d8,(ostream *)&std::cerr);
            }
          }
          cpprofiler::Connector::sendNode(local_d8._c,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.info_.value_._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8.info_.value_._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.nogood_.value_._M_dataplus._M_p != paVar2) {
            operator_delete(local_d8.nogood_.value_._M_dataplus._M_p);
          }
          iVar7 = nextnodeid;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.label_.value_._M_dataplus._M_p != paVar1) {
            operator_delete(local_d8.label_.value_._M_dataplus._M_p);
            iVar7 = nextnodeid;
          }
        }
        nextnodeid = iVar7;
        std::vector<int,_std::allocator<int>_>::resize
                  (&nodepath,
                   ((long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 1);
        std::vector<int,_std::allocator<int>_>::resize
                  (&altpath,((long)altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)altpath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2) - 1);
        uVar6 = (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)nodepath.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
      } while (decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[newDecisionLevel] < (int)(uVar6 >> 2));
    }
    return;
  }
  if (rewindStyle == REWIND_OMIT_SKIPPED) {
    std::vector<int,_std::allocator<int>_>::resize
              (&nodepath,
               (long)decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[newDecisionLevel]);
    std::vector<int,_std::allocator<int>_>::resize
              (&altpath,(long)decisionLevelTip.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[newDecisionLevel] - 1);
    return;
  }
  abort();
}

Assistant:

void rewindPaths(int previousDecisionLevel, int newDecisionLevel, RewindStyle rewindStyle,
								 long /*timestamp*/) {
	switch (rewindStyle) {
		case REWIND_OMIT_SKIPPED:
			nodepath.resize(decisionLevelTip[newDecisionLevel]);
			altpath.resize(decisionLevelTip[newDecisionLevel] - 1);
			break;
		case REWIND_SEND_SKIPPED:
#if DEBUG_VERBOSE
			std::cerr << "rewinding to level " << newDecisionLevel << "\n";
			std::cerr << "before, nodepath is: " << showVector(nodepath) << "\n";
			std::cerr << "     and altpath is: " << showVector(altpath) << "\n";
			std::cerr << "       and dlTip is: " << showVector(decisionLevelTip) << "\n";
#endif

			// The tip of the nodepath and altpath lead us to the node
			// that failed.  (That is, the last element of nodepath is the
			// id of the node that failed.)  We first unwind that tip to
			// the next decision level, so that we don't send a "skipped
			// child" for that node or any others at this level.
			nodepath.resize(decisionLevelTip[previousDecisionLevel - 1]);
			altpath.resize(decisionLevelTip[previousDecisionLevel - 1] - 1);

			// Now walk back through the decision levels, sending a
			// "skipped" node for each child that was never visited.
			while (static_cast<int>(nodepath.size()) > decisionLevelTip[newDecisionLevel]) {
				const int nodeid = nextnodeid;
				nextnodeid++;
				const int parent = (nodepath.empty()) ? (-1) : (nodepath[nodepath.size() - 1]);
				int myalt = (altpath.empty()) ? (-1) : (altpath[altpath.size() - 1]);

				// myalt is the alternative that led to the failure; the
				// skipped node is conceptually the next alternative.
				myalt++;

#ifdef HAS_PROFILER
				if (doProfiling()) {
					sendNode(profilerConnector->createNode({nodeid, engine.restart_count, 0}, {parent, 0, 0},
																								 myalt, 0, cpprofiler::NodeStatus::SKIPPED));
					//    .set_decision_level(currentDecisionLevel)
					//    .set_time(timestamp));
				}
#endif
				nodepath.resize(nodepath.size() - 1);
				altpath.resize(altpath.size() - 1);
			}
#if DEBUG_VERBOSE
			std::cerr << "after, nodepath is: " << showVector(nodepath) << "\n";
			std::cerr << "    and altpath is: " << showVector(altpath) << "\n";
			std::cerr << "       and dlTip is: " << showVector(decisionLevelTip) << "\n";
#endif
			break;
		default:
			std::abort();
	}
}